

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_fixup_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::InterpFixupPass::Process(InterpFixupPass *this)

{
  bool bVar1;
  Status SVar2;
  IRContext *context;
  InterpFoldingRules *this_00;
  IRContext *ctx;
  Module *this_01;
  reference this_02;
  anon_class_16_2_d1d79171 local_b8;
  function<void_(spvtools::opt::Instruction_*)> local_a8;
  reference local_88;
  Function *func;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  unique_ptr<spvtools::opt::(anonymous_namespace)::InterpConstFoldingRules,_std::default_delete<spvtools::opt::(anonymous_namespace)::InterpConstFoldingRules>_>
  local_50;
  unique_ptr<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
  local_48;
  unique_ptr<spvtools::opt::(anonymous_namespace)::InterpFoldingRules,_std::default_delete<spvtools::opt::(anonymous_namespace)::InterpFoldingRules>_>
  local_40;
  unique_ptr<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
  local_38;
  undefined1 local_30 [8];
  InstructionFolder folder;
  bool changed;
  InterpFixupPass *this_local;
  
  folder.folding_rules_._M_t.
  super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
  .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl._7_1_ = 0;
  context = Pass::context(&this->super_Pass);
  this_00 = (InterpFoldingRules *)operator_new(0x90);
  ctx = Pass::context(&this->super_Pass);
  anon_unknown_0::InterpFoldingRules::InterpFoldingRules(this_00,ctx);
  std::
  unique_ptr<spvtools::opt::(anonymous_namespace)::InterpFoldingRules,std::default_delete<spvtools::opt::(anonymous_namespace)::InterpFoldingRules>>
  ::unique_ptr<std::default_delete<spvtools::opt::(anonymous_namespace)::InterpFoldingRules>,void>
            ((unique_ptr<spvtools::opt::(anonymous_namespace)::InterpFoldingRules,std::default_delete<spvtools::opt::(anonymous_namespace)::InterpFoldingRules>>
              *)&local_40,this_00);
  std::unique_ptr<spvtools::opt::FoldingRules,std::default_delete<spvtools::opt::FoldingRules>>::
  unique_ptr<spvtools::opt::(anonymous_namespace)::InterpFoldingRules,std::default_delete<spvtools::opt::(anonymous_namespace)::InterpFoldingRules>,void>
            ((unique_ptr<spvtools::opt::FoldingRules,std::default_delete<spvtools::opt::FoldingRules>>
              *)&local_38,&local_40);
  __range2 = (Module *)Pass::context(&this->super_Pass);
  MakeUnique<spvtools::opt::(anonymous_namespace)::InterpConstFoldingRules,spvtools::opt::IRContext*>
            ((spvtools *)&local_50,(IRContext **)&__range2);
  std::
  unique_ptr<spvtools::opt::ConstantFoldingRules,std::default_delete<spvtools::opt::ConstantFoldingRules>>
  ::
  unique_ptr<spvtools::opt::(anonymous_namespace)::InterpConstFoldingRules,std::default_delete<spvtools::opt::(anonymous_namespace)::InterpConstFoldingRules>,void>
            ((unique_ptr<spvtools::opt::ConstantFoldingRules,std::default_delete<spvtools::opt::ConstantFoldingRules>>
              *)&local_48,&local_50);
  InstructionFolder::InstructionFolder((InstructionFolder *)local_30,context,&local_38,&local_48);
  std::
  unique_ptr<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
  ::~unique_ptr(&local_48);
  std::
  unique_ptr<spvtools::opt::(anonymous_namespace)::InterpConstFoldingRules,_std::default_delete<spvtools::opt::(anonymous_namespace)::InterpConstFoldingRules>_>
  ::~unique_ptr(&local_50);
  std::unique_ptr<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>::
  ~unique_ptr(&local_38);
  std::
  unique_ptr<spvtools::opt::(anonymous_namespace)::InterpFoldingRules,_std::default_delete<spvtools::opt::(anonymous_namespace)::InterpFoldingRules>_>
  ::~unique_ptr(&local_40);
  this_01 = Pass::get_module(&this->super_Pass);
  join_0x00000010_0x00000000_ = Module::begin(this_01);
  _func = Module::end(this_01);
  while( true ) {
    bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_,
                       (UptrVectorIterator<spvtools::opt::Function,_false> *)&func);
    if (!bVar1) break;
    this_02 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                        ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
    local_b8.changed =
         (bool *)((long)&folder.folding_rules_._M_t.
                         super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
                         .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false> + 7);
    local_b8.folder = (InstructionFolder *)local_30;
    local_88 = this_02;
    std::function<void(spvtools::opt::Instruction*)>::
    function<spvtools::opt::InterpFixupPass::Process()::__0,void>
              ((function<void(spvtools::opt::Instruction*)> *)&local_a8,&local_b8);
    Function::ForEachInst(this_02,&local_a8,false,false);
    std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_a8);
    UptrVectorIterator<spvtools::opt::Function,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
  }
  SVar2 = SuccessWithoutChange;
  if ((folder.folding_rules_._M_t.
       super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
       .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl._7_1_ & 1) != 0) {
    SVar2 = SuccessWithChange;
  }
  InstructionFolder::~InstructionFolder((InstructionFolder *)local_30);
  return SVar2;
}

Assistant:

Pass::Status InterpFixupPass::Process() {
  bool changed = false;

  // Traverse the body of the functions to replace instructions that require
  // the extensions.
  InstructionFolder folder(
      context(),
      std::unique_ptr<InterpFoldingRules>(new InterpFoldingRules(context())),
      MakeUnique<InterpConstFoldingRules>(context()));
  for (Function& func : *get_module()) {
    func.ForEachInst([&changed, &folder](Instruction* inst) {
      if (folder.FoldInstruction(inst)) {
        changed = true;
      }
    });
  }

  return changed ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}